

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_lee_2021_bmrs.h
# Opt level: O2

void __thiscall
BMRS<RemSP>::PerformLabelingMem
          (BMRS<RemSP> *this,vector<unsigned_long,_std::allocator<unsigned_long>_> *accesses)

{
  Data_Compressed *this_00;
  Runs *this_01;
  int *piVar1;
  undefined8 uVar2;
  ushort uVar3;
  ushort uVar4;
  uint uVar5;
  Mat1b *pMVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  pointer puVar11;
  pointer piVar12;
  BMRS<RemSP> *this_02;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar13;
  Run *pRVar14;
  int k;
  long lVar15;
  long lVar16;
  Run *pRVar17;
  long lVar18;
  ulong uVar19;
  void *__child_stack;
  int j;
  ulong uVar20;
  int iVar21;
  int iVar22;
  uint _height;
  uint64_t *puVar23;
  uint uVar24;
  uint64_t *puVar25;
  ulong uVar26;
  void *__arg;
  uint64_t *puVar27;
  uint64_t *puVar28;
  uint64_t *puVar29;
  int j_2;
  long lVar30;
  double dVar31;
  allocator_type local_351;
  ulong local_350;
  int local_344;
  ulong local_340;
  ulong local_338;
  BMRS<RemSP> *local_330;
  ulong local_328;
  int local_31c;
  Data_Compressed *local_318;
  Data_Compressed *local_310;
  ulong local_308;
  ulong local_300;
  long local_2f8;
  ulong local_2f0;
  Data_Compressed *local_2e8;
  Runs *local_2e0;
  long local_2d8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_2d0;
  ulong local_2c8;
  pointer local_2c0;
  pointer local_2b8;
  Run *local_2b0;
  undefined8 local_2a8;
  undefined8 local_2a0;
  undefined8 local_298;
  MemMat<int> img_labels;
  value_type_conflict3 local_1c8;
  Size local_1c0;
  Mat_<int> local_1b8;
  MemMat<unsigned_char> img;
  Mat local_90 [96];
  
  local_2d0 = accesses;
  cv::Mat::Mat(local_90,&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->super_Mat);
  MemMat<unsigned_char>::MemMat(&img,(Mat_<unsigned_char> *)local_90);
  cv::Mat::~Mat(local_90);
  uVar2 = **(undefined8 **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x40;
  local_1c0.height = (int)uVar2;
  local_1c0.width = (int)((ulong)uVar2 >> 0x20);
  MemMat<int>::MemMat(&img_labels,&local_1c0,0);
  pMVar6 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  uVar5 = *(uint *)&pMVar6->field_0x8;
  iVar21 = *(int *)&pMVar6->field_0xc;
  this_00 = &this->data_compressed;
  Data_Compressed::Alloc(this_00,uVar5,iVar21);
  local_310 = this_00;
  InitCompressedDataMem(this,this_00,&img);
  uVar20 = (long)(int)uVar5 / 2;
  uVar19 = (long)(int)uVar5 % 2;
  local_308 = uVar19 & 0xffffffff;
  iVar22 = (int)uVar20;
  _height = iVar22 + (int)uVar19;
  local_340 = (ulong)_height;
  uVar24 = (this->data_compressed).data_width;
  local_318 = &this->data_merged;
  local_350 = (ulong)uVar5;
  Data_Compressed::Alloc(local_318,_height,iVar21);
  local_2f8 = (long)iVar21;
  local_2d8 = (long)(int)local_350;
  puVar23 = (this->data_compressed).bits;
  puVar25 = (this->data_merged).bits;
  lVar15 = (long)(this->data_compressed).data_width;
  lVar18 = (long)(this->data_merged).data_width;
  uVar26 = 0;
  uVar19 = 0;
  if (0 < (int)uVar24) {
    uVar19 = (ulong)uVar24;
  }
  local_300 = 0;
  if (0 < iVar22) {
    local_300 = uVar20 & 0xffffffff;
  }
  puVar27 = puVar23 + lVar15;
  for (; uVar26 != local_300; uVar26 = uVar26 + 1) {
    for (uVar20 = 0; uVar19 != uVar20; uVar20 = uVar20 + 1) {
      puVar25[uVar20] = puVar27[uVar20] | puVar23[uVar20];
    }
    puVar25 = puVar25 + lVar18;
    puVar27 = puVar27 + lVar15 * 2;
    puVar23 = puVar23 + lVar15 * 2;
  }
  if ((int)local_308 != 0) {
    puVar23 = local_310->bits;
    puVar25 = local_318->bits;
    for (uVar20 = 0; uVar19 != uVar20; uVar20 = uVar20 + 1) {
      puVar25[lVar18 * iVar22 + uVar20] = puVar23[lVar15 * ((int)local_350 + -1) + uVar20];
    }
  }
  local_2e8 = &this->data_flags;
  local_330 = this;
  Data_Compressed::Alloc(local_2e8,(int)local_340 + -1,iVar21);
  this_02 = local_330;
  uVar5 = (this->data_flags).height;
  puVar23 = (this->data_compressed).bits;
  puVar25 = (this->data_flags).bits;
  lVar15 = (long)(this->data_compressed).data_width;
  uVar20 = 0;
  local_338 = (ulong)uVar5;
  if ((int)uVar5 < 1) {
    local_338 = uVar20;
  }
  lVar18 = (long)(this->data_flags).data_width;
  puVar27 = puVar23 + lVar15;
  local_328 = lVar18 * 8;
  puVar29 = puVar25;
  puVar28 = puVar23;
  for (; puVar28 = puVar28 + lVar15 * 2, uVar20 != local_338; uVar20 = uVar20 + 1) {
    puVar25[uVar20 * lVar18] =
         (puVar23[(uVar20 * 2 + 2) * lVar15] * 2 | puVar23[(uVar20 * 2 + 2) * lVar15]) &
         (puVar23[(uVar20 * 2 + 1) * lVar15] * 2 | puVar23[(uVar20 * 2 + 1) * lVar15]);
    for (lVar30 = 1; lVar30 < (int)uVar24; lVar30 = lVar30 + 1) {
      puVar29[lVar30] =
           (puVar28[lVar30 + -1] >> 0x3f | puVar28[lVar30] << 1 | puVar28[lVar30]) &
           (puVar27[lVar30 + -1] >> 0x3f | puVar27[lVar30] << 1 | puVar27[lVar30]);
    }
    puVar27 = puVar27 + lVar15 * 2;
    puVar29 = puVar29 + lVar18;
  }
  this_01 = &local_330->data_runs;
  local_344 = iVar21;
  Runs::Alloc(this_01,(int)local_350,iVar21);
  uVar2 = *(undefined8 *)&((this_02->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x8;
  RemSP::MemAlloc((((int)((ulong)uVar2 >> 0x20) + 1) / 2) * (((int)uVar2 + 1) / 2) + 1);
  RemSP::MemSetup();
  __arg = (void *)(ulong)uVar24;
  FindRunsMem(this_02,(this_02->data_merged).bits,(this_02->data_flags).bits,(int)local_340,uVar24,
              (this_02->data_runs).runs);
  pRVar17 = this_01->runs;
  lVar15 = 1;
  lVar18 = 0;
  uVar20 = 0;
  while (uVar19 = uVar20,
        piVar12 = RemSP::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start,
        puVar11 = RemSP::mem_P_.vec_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                  ._M_impl.super__Vector_impl_data._M_start, uVar19 != local_300) {
    local_2b8 = RemSP::mem_P_.vec_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_start;
    local_2c0 = RemSP::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
    pRVar14 = pRVar17;
    iVar21 = 0;
    do {
      pRVar17 = pRVar14;
      uVar3 = pRVar17->start_pos;
      local_2f0 = (ulong)uVar3;
      if (local_2f0 == 0xffff) {
        lVar16 = (long)iVar21;
        for (lVar30 = lVar16; lVar30 < local_2f8; lVar30 = lVar30 + 1) {
          piVar1 = (int *)(*(long *)img_labels.accesses_._72_8_ * lVar18 +
                           img_labels.accesses_._16_8_ + lVar30 * 4);
          *piVar1 = *piVar1 + 1;
          *(undefined4 *)
           (*(long *)img_labels.img_._72_8_ * lVar18 + img_labels.img_._16_8_ + lVar30 * 4) = 0;
        }
        for (; lVar16 < local_2f8; lVar16 = lVar16 + 1) {
          piVar1 = (int *)(*(long *)img_labels.accesses_._72_8_ * lVar15 +
                           img_labels.accesses_._16_8_ + lVar16 * 4);
          *piVar1 = *piVar1 + 1;
          *(undefined4 *)
           (*(long *)img_labels.img_._72_8_ * lVar15 + img_labels.img_._16_8_ + lVar16 * 4) = 0;
        }
        pRVar17 = pRVar17 + 1;
        __arg = (void *)img_labels.img_._16_8_;
        iVar22 = iVar21;
      }
      else {
        local_328 = (ulong)pRVar17->end_pos;
        uVar5 = pRVar17->label;
        piVar1 = piVar12 + (int)uVar5;
        *piVar1 = *piVar1 + 1;
        uVar5 = puVar11[(int)uVar5];
        local_350 = CONCAT44(local_350._4_4_,uVar5);
        lVar30 = 0;
        local_338 = (ulong)iVar21;
        for (uVar20 = local_338; (long)uVar20 < (long)local_2f0; uVar20 = uVar20 + 1) {
          lVar16 = *(long *)img_labels.accesses_._72_8_;
          piVar1 = (int *)(lVar18 * lVar16 + img_labels.accesses_._16_8_ + uVar20 * 4);
          *piVar1 = *piVar1 + 1;
          lVar7 = *(long *)img_labels.img_._72_8_;
          *(undefined4 *)(lVar18 * lVar7 + img_labels.img_._16_8_ + uVar20 * 4) = 0;
          piVar1 = (int *)(lVar16 * lVar15 + img_labels.accesses_._16_8_ + uVar20 * 4);
          *piVar1 = *piVar1 + 1;
          *(undefined4 *)(lVar7 * lVar15 + img_labels.img_._16_8_ + uVar20 * 4) = 0;
          lVar30 = lVar30 + 1;
        }
        local_340 = img.img_._72_8_;
        local_298 = img.accesses_._72_8_;
        local_2a0 = img_labels.img_._72_8_;
        local_2a8 = img_labels.accesses_._72_8_;
        lVar16 = local_338 * 4;
        __arg = (void *)(img.img_._16_8_ + local_338);
        for (; (long)(local_338 + lVar30) < (long)local_328; lVar30 = lVar30 + 1) {
          lVar7 = *(long *)img.accesses_._72_8_;
          piVar1 = (int *)(lVar18 * lVar7 + img.accesses_._16_8_ + lVar16 + lVar30 * 4);
          *piVar1 = *piVar1 + 1;
          lVar8 = *(long *)img.img_._72_8_;
          lVar9 = *(long *)img_labels.accesses_._72_8_;
          uVar24 = uVar5;
          if (*(char *)((long)__arg + lVar30 + lVar18 * lVar8) == '\0') {
            uVar24 = 0;
          }
          piVar1 = (int *)(lVar18 * lVar9 + lVar16 + img_labels.accesses_._16_8_ + lVar30 * 4);
          *piVar1 = *piVar1 + 1;
          lVar10 = *(long *)img_labels.img_._72_8_;
          *(uint *)(lVar18 * lVar10 + img_labels.img_._16_8_ + lVar16 + lVar30 * 4) = uVar24;
          piVar1 = (int *)(lVar7 * lVar15 + img.accesses_._16_8_ + lVar16 + lVar30 * 4);
          *piVar1 = *piVar1 + 1;
          uVar24 = uVar5;
          if (*(char *)((long)__arg + lVar30 + lVar8 * lVar15) == '\0') {
            uVar24 = 0;
          }
          piVar1 = (int *)(lVar9 * lVar15 + lVar16 + img_labels.accesses_._16_8_ + lVar30 * 4);
          *piVar1 = *piVar1 + 1;
          *(uint *)(lVar10 * lVar15 + img_labels.img_._16_8_ + lVar16 + lVar30 * 4) = uVar24;
        }
        iVar22 = iVar21 + (int)lVar30;
        local_31c = iVar21;
        local_2b0 = pRVar17;
      }
      pRVar14 = pRVar17 + 1;
      iVar21 = iVar22;
    } while (uVar3 != 0xffff);
    lVar18 = lVar18 + 2;
    lVar15 = lVar15 + 2;
    local_2c8 = uVar19;
    uVar20 = uVar19 + 1;
  }
  if ((int)local_308 != 0) {
    lVar15 = local_2d8 + -1;
    uVar20 = 0;
    do {
      uVar3 = pRVar17->start_pos;
      uVar19 = (ulong)uVar3;
      if (uVar19 == 0xffff) {
        lVar18 = (long)(int)uVar20 * 4;
        for (uVar19 = uVar20 & 0xffffffff; __arg = (void *)img_labels.accesses_._72_8_,
            (int)uVar19 < local_344; uVar19 = (ulong)((int)uVar19 + 1)) {
          piVar1 = (int *)(img_labels.accesses_._16_8_ + lVar18 +
                          *(long *)img_labels.accesses_._72_8_ * lVar15);
          *piVar1 = *piVar1 + 1;
          *(undefined4 *)
           (lVar18 + img_labels.img_._16_8_ + *(long *)img_labels.img_._72_8_ * lVar15) = 0;
        }
      }
      else {
        uVar4 = pRVar17->end_pos;
        uVar5 = pRVar17->label;
        piVar1 = piVar12 + (int)uVar5;
        *piVar1 = *piVar1 + 1;
        uVar5 = puVar11[(int)uVar5];
        for (lVar18 = (long)(int)uVar20; lVar18 < (long)uVar19; lVar18 = lVar18 + 1) {
          piVar1 = (int *)(*(long *)img_labels.accesses_._72_8_ * lVar15 +
                           img_labels.accesses_._16_8_ + lVar18 * 4);
          *piVar1 = *piVar1 + 1;
          *(undefined4 *)
           (*(long *)img_labels.img_._72_8_ * lVar15 + img_labels.img_._16_8_ + lVar18 * 4) = 0;
        }
        for (; uVar20 = uVar19, __arg = (void *)(ulong)uVar5, uVar19 < uVar4; uVar19 = uVar19 + 1) {
          piVar1 = (int *)(*(long *)img_labels.accesses_._72_8_ * lVar15 +
                           img_labels.accesses_._16_8_ + uVar19 * 4);
          *piVar1 = *piVar1 + 1;
          *(uint *)(*(long *)img_labels.img_._72_8_ * lVar15 + img_labels.img_._16_8_ + uVar19 * 4)
               = uVar5;
        }
      }
      pRVar17 = pRVar17 + 1;
    } while (uVar3 != 0xffff);
  }
  local_1c8 = 0;
  local_2e0 = this_01;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_1b8,4,&local_1c8,
             &local_351);
  pvVar13 = local_2d0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_move_assign(local_2d0,&local_1b8);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&local_1b8);
  dVar31 = MemMat<unsigned_char>::GetTotalAccesses(&img);
  *(pvVar13->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
   super__Vector_impl_data._M_start =
       (long)(dVar31 - 9.223372036854776e+18) & (long)dVar31 >> 0x3f | (long)dVar31;
  dVar31 = MemMat<int>::GetTotalAccesses(&img_labels);
  (pvVar13->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
  super__Vector_impl_data._M_start[1] =
       (long)dVar31 >> 0x3f & (long)(dVar31 - 9.223372036854776e+18) | (long)dVar31;
  dVar31 = RemSP::MemTotalAccesses();
  __child_stack =
       (void *)((long)dVar31 >> 0x3f & (long)(dVar31 - 9.223372036854776e+18) | (long)dVar31);
  (pvVar13->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
  super__Vector_impl_data._M_start[2] = (unsigned_long)__child_stack;
  cv::Mat_<int>::clone
            (&local_1b8,(__fn *)&img_labels.img_,__child_stack,
             (int)(long)(dVar31 - 9.223372036854776e+18),__arg);
  cv::Mat::operator=(&((local_330->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->
                      super_Mat,&local_1b8.super_Mat);
  cv::Mat::~Mat(&local_1b8.super_Mat);
  Runs::Dealloc(this_01);
  Data_Compressed::Dealloc(local_2e8);
  Data_Compressed::Dealloc(local_318);
  Data_Compressed::Dealloc(local_310);
  MemMat<int>::~MemMat(&img_labels);
  MemMat<unsigned_char>::~MemMat(&img);
  return;
}

Assistant:

void PerformLabelingMem(std::vector<uint64_t>& accesses) {
        //Data structure for memory test
        MemMat<unsigned char> img(img_);
        MemMat<int> img_labels(img_.size(), 0);

        int w(img_.cols);
        int h(img_.rows);

        data_compressed.Alloc(h, w);
        InitCompressedDataMem(data_compressed, img);

        //generate merged data
        int h_merge = h / 2 + h % 2;
        int data_width = data_compressed.data_width;
        data_merged.Alloc(h_merge, w);
        for (int i = 0; i < h / 2; i++) {
            uint64_t* pdata_source1 = data_compressed[2 * i];
            uint64_t* pdata_source2 = data_compressed[2 * i + 1];
            uint64_t* pdata_merged = data_merged[i];
            for (int j = 0; j < data_width; j++) pdata_merged[j] = pdata_source1[j] | pdata_source2[j];
        }
        if (h % 2) {
            uint64_t* pdata_source = data_compressed[h - 1];
            uint64_t* pdata_merged = data_merged[h / 2];
            for (int j = 0; j < data_width; j++) pdata_merged[j] = pdata_source[j];
        }

        //generate flag bits
        data_flags.Alloc(h_merge - 1, w);
        for (int i = 0; i < data_flags.height; i++) {
            uint64_t* bits_u = data_compressed[2 * i + 1];
            uint64_t* bits_d = data_compressed[2 * i + 2];
            uint64_t* bits_dest = data_flags[i];

            uint64_t u0 = bits_u[0];
            uint64_t d0 = bits_d[0];
            bits_dest[0] = (u0 | (u0 << 1)) & (d0 | (d0 << 1));
            for (int j = 1; j < data_width; j++) {
                uint64_t u = bits_u[j];
                uint64_t u_shl = u << 1;
                uint64_t d = bits_d[j];
                uint64_t d_shl = d << 1;
                if (bits_u[j - 1] & 0x8000000000000000) u_shl |= 1;
                if (bits_d[j - 1] & 0x8000000000000000) d_shl |= 1;
                bits_dest[j] = (u | u_shl) & (d | d_shl);
            }
        }

        //find runs
        data_runs.Alloc(h, w);
        LabelsSolver::MemAlloc(UPPER_BOUND_8_CONNECTIVITY);
        LabelsSolver::MemSetup();
        FindRunsMem(data_merged.bits, data_flags.bits, h_merge, data_width, data_runs.runs);

        Run* runs = data_runs.runs;
        for (int i = 0; i < h / 2; i++) {
            int i_u = 2 * i;
            int i_d = i_u + 1;

            for (int j = 0;; runs++) {
                unsigned short start_pos = runs->start_pos;
                if (start_pos == 0xFFFF) {
                    for (int k = j; k < w; k++) img_labels(i_u, k) = 0;
                    for (int k = j; k < w; k++) img_labels(i_d, k) = 0;
                    runs++;
                    break;
                }
                unsigned short end_pos = runs->end_pos;
                int label = LabelsSolver::MemGetLabel(runs->label);

                for (; j < start_pos; j++) img_labels(i_u, j) = 0, img_labels(i_d, j) = 0;
                for (; j < end_pos; j++) {
                    img_labels(i_u, j) = img(i_u, j) ? label : 0;
                    img_labels(i_d, j) = img(i_d, j) ? label : 0;
                }
            }
        }
        if (h % 2) {
            int i = h - 1;
            for (int j = 0;; runs++) {
                unsigned short start_pos = runs->start_pos;
                if (start_pos == 0xFFFF) {
                    for (int k = j; k < w; k++) img_labels(i, j) = 0;
                    break;
                }
                unsigned short end_pos = runs->end_pos;
                int label = LabelsSolver::MemGetLabel(runs->label);
                for (; j < start_pos; j++) img_labels(i, j) = 0;
                for (j = start_pos; j < end_pos; j++) img_labels(i, j) = label;
            }
        }

        // Store total accesses in the output vector 'accesses'
        accesses = std::vector<uint64_t>((int)MD_SIZE, 0);

        accesses[MD_BINARY_MAT] = (uint64_t)img.GetTotalAccesses();
        accesses[MD_LABELED_MAT] = (uint64_t)img_labels.GetTotalAccesses();
        accesses[MD_EQUIVALENCE_VEC] = (uint64_t)LabelsSolver::MemTotalAccesses();

        img_labels_ = img_labels.GetImage();

        LabelsSolver::MemDealloc();
        data_runs.Dealloc();
        data_flags.Dealloc();
        data_merged.Dealloc();
        data_compressed.Dealloc();
    }